

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O1

MPP_RET avs2d_reset_parser(Avs2dCtx_t *p_dec)

{
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","In.","avs2d_reset_parser");
  }
  p_dec->new_frame_flag = 0;
  p_dec->new_seq_flag = 0;
  p_dec->got_vsh = 0;
  p_dec->got_exh = 0;
  *(undefined8 *)((long)&p_dec->got_exh + 1) = 0;
  reset_nalu_buf(p_dec);
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","Out.","avs2d_reset_parser");
  }
  return MPP_OK;
}

Assistant:

MPP_RET avs2d_reset_parser(Avs2dCtx_t *p_dec)
{
    AVS2D_PARSE_TRACE("In.");
    p_dec->got_vsh      = 0;
    p_dec->got_exh      = 0;
    p_dec->got_keyframe = 0;
    p_dec->enable_wq    = 0;
    p_dec->new_frame_flag = 0;
    p_dec->new_seq_flag = 0;
    reset_nalu_buf(p_dec);
    AVS2D_PARSE_TRACE("Out.");

    return MPP_OK;
}